

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O2

void * raviX_realloc_array(void *oldp,size_t element_size,size_t old_n,size_t new_n)

{
  void *pvVar1;
  
  if (new_n == 0) {
    free(oldp);
    pvVar1 = (void *)0x0;
  }
  else {
    if (new_n <= old_n) {
      __assert_fail("new_n > old_n",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/allocate.c"
                    ,0x40,"void *raviX_realloc_array(void *, size_t, size_t, size_t)");
    }
    pvVar1 = realloc(oldp,new_n * element_size);
    if (pvVar1 == (void *)0x0) {
      fwrite("out of memory\n",0xe,1,_stderr);
      abort();
    }
    memset((void *)((long)pvVar1 + old_n * element_size),0,
           new_n * element_size - old_n * element_size);
  }
  return pvVar1;
}

Assistant:

void *raviX_realloc_array(void *oldp, size_t element_size, size_t old_n, size_t new_n)
{
	if (new_n == 0) {
		raviX_free(oldp);
		return NULL;
	}
	assert(new_n > old_n);
	size_t newsize = element_size * new_n;
	void *newp = realloc(oldp, newsize);
	if (!newp) {
		fprintf(stderr, "out of memory\n");
		abort();
	}
	size_t oldsize = old_n * element_size;
	char *p = (char *)newp;
	memset(p + oldsize, 0, newsize - oldsize);
	return newp;
}